

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

void prf_state_destroy(prf_state_t *state)

{
  int iVar1;
  void *in_RDI;
  int i;
  int cnt;
  undefined4 local_10;
  
  iVar1 = prf_array_count((void *)0x106237);
  for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
    free(*(void **)(*(long *)((long)in_RDI + 0x48) + (long)local_10 * 8));
  }
  free(*(void **)((long)in_RDI + 0x50));
  prf_array_free((void *)0x10628d);
  prf_array_free((void *)0x10629b);
  prf_array_free((void *)0x1062a9);
  prf_array_free((void *)0x1062b7);
  free(in_RDI);
  return;
}

Assistant:

void
prf_state_destroy(
    prf_state_t * state )
{
    int cnt, i;
    assert( state != NULL );
    cnt = prf_array_count( state->matrix );
    for ( i = 0; i < cnt; i++ )
        free( state->matrix[i] );
    free( state->inv_matrix );
    prf_array_free( state->materials );
    prf_array_free( state->textures );
    prf_array_free( state->instances );
    prf_array_free( state->matrix );
    free( state );
}